

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_slice.c
# Opt level: O0

_Bool slice_fseek(ALLEGRO_FILE *f,int64_t offset,int whence)

{
  _Bool _Var1;
  void *offset_00;
  long lVar2;
  int in_EDX;
  long in_RSI;
  ALLEGRO_FILE *in_RDI;
  SLICE_DATA *slice;
  undefined4 in_stack_ffffffffffffffe0;
  ulong local_18;
  _Bool local_1;
  
  offset_00 = al_get_file_userdata(in_RDI);
  if (in_EDX == 0) {
    lVar2 = *(long *)((long)offset_00 + 8);
  }
  else if (in_EDX == 1) {
    lVar2 = *(long *)((long)offset_00 + 8) + *(long *)((long)offset_00 + 0x10);
  }
  else {
    if (in_EDX != 2) {
      return false;
    }
    lVar2 = *(long *)((long)offset_00 + 8) + *(long *)((long)offset_00 + 0x18);
  }
  local_18 = lVar2 + in_RSI;
  if (local_18 < *(ulong *)((long)offset_00 + 8)) {
    local_18 = *(ulong *)((long)offset_00 + 8);
  }
  else if (((ulong)(*(long *)((long)offset_00 + 8) + *(long *)((long)offset_00 + 0x18)) < local_18)
          && ((*(uint *)((long)offset_00 + 0x20) & 4) == 0)) {
    local_18 = *(long *)((long)offset_00 + 8) + *(long *)((long)offset_00 + 0x18);
  }
  _Var1 = al_fseek((ALLEGRO_FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),(int64_t)offset_00,0);
  if (_Var1) {
    *(ulong *)((long)offset_00 + 0x10) = local_18 - *(long *)((long)offset_00 + 8);
    if (*(ulong *)((long)offset_00 + 0x18) < *(ulong *)((long)offset_00 + 0x10)) {
      *(undefined8 *)((long)offset_00 + 0x18) = *(undefined8 *)((long)offset_00 + 0x10);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool slice_fseek(ALLEGRO_FILE *f, int64_t offset, int whence)
{
   SLICE_DATA *slice = al_get_file_userdata(f);
   
   if (whence == ALLEGRO_SEEK_SET) {
      offset = slice->anchor + offset;
   }
   else if (whence == ALLEGRO_SEEK_CUR) {
      offset = slice->anchor + slice->pos + offset;
   }
   else if (whence == ALLEGRO_SEEK_END) {
      offset = slice->anchor + slice->size + offset;
   }
   else {
      return false;
   }
   
   if ((size_t) offset < slice->anchor) {
      offset = slice->anchor;
   }
   else if ((size_t) offset > slice->anchor + slice->size) {
      if (!(slice->mode & SLICE_EXPANDABLE)) {
         offset = slice->anchor + slice->size;
      }
   }
   
   if (al_fseek(slice->fp, offset, ALLEGRO_SEEK_SET)) {
      slice->pos = offset - slice->anchor;
      if (slice->pos > slice->size)
         slice->size = slice->pos;
      return true;
   }
   
   return false;
}